

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O0

void __thiscall
QDuplicateTracker<QString,_32UL>::QDuplicateTracker
          (QDuplicateTracker<QString,_32UL> *this,qsizetype n)

{
  allocator_type *in_RDI;
  long in_FS_OFFSET;
  memory_resource *__r;
  void *in_stack_ffffffffffffffb8;
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  *this_00;
  monotonic_buffer_resource *in_stack_ffffffffffffffc0;
  polymorphic_allocator<QString> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __r = (memory_resource *)(in_RDI + 0xc0);
  std::pmr::monotonic_buffer_resource::monotonic_buffer_resource
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t)__r);
  this_00 = (unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
             *)(in_RDI + 200);
  std::pmr::polymorphic_allocator<QString>::polymorphic_allocator(&local_10,__r);
  std::
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  ::unordered_set(this_00,(size_type)__r,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QDuplicateTracker(qsizetype n)
#ifdef __cpp_lib_memory_resource
        : set{size_t(n), &res}
#else
        : set{n}
#endif
    {}